

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

int sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  File *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ZipArchive *pZVar4;
  uint32_t uVar5;
  int iVar6;
  BIO *bp;
  RSA *rsa;
  undefined8 *puVar7;
  uint uVar8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var9;
  allocator_type *__a;
  uint uVar10;
  void *pvVar11;
  char *pcVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar13;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *v_1;
  void *data_00;
  size_t len;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined4 in_stack_fffffffffffffa54;
  undefined1 local_5a8 [8];
  SHA_CTX context;
  uint8_t manifestSha [20];
  uchar local_528 [8];
  uchar sha [20];
  uchar local_50a [18];
  undefined1 local_4f8 [8];
  string head;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_4c0;
  undefined1 local_4a8 [8];
  string sigHead;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_470;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_440;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_410;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_398;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_380;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_368;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_350;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_290;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  uchar local_212 [18];
  uchar digest [20];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  undefined1 local_1d0 [8];
  DER certData;
  vector<char,_std::allocator<char>_> digestCopy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> certificate;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sign;
  string pemKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  undefined1 local_e8 [8];
  string manifestMF;
  string certSF;
  vector<unsigned_char,_std::allocator<unsigned_char>_> certMetaData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_68;
  uint local_44;
  ZipArchive *pZStack_40;
  uint signLen;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  pZStack_40 = (ZipArchive *)ctx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4f8,"Manifest-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\n\r\n",
             (allocator<char> *)local_1d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)siglen);
  SHA1_Init((SHA_CTX *)local_5a8);
  SHA1_Update((SHA_CTX *)local_5a8,(void *)local_e8,(size_t)manifestMF._M_dataplus._M_p);
  SHA1_Final((uchar *)(context.data + 0xf),(SHA_CTX *)local_5a8);
  uVar5 = crc32_fast((void *)local_e8,(size_t)manifestMF._M_dataplus._M_p,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d0,"META-INF/MANIFEST.MF",(allocator<char> *)local_4a8);
  pZVar4 = pZStack_40;
  ZipArchive::addFile(pZStack_40,(string *)local_1d0,true,(uint64_t)manifestMF._M_dataplus._M_p,
                      (uint64_t)manifestMF._M_dataplus._M_p,0,uVar5,0);
  std::__cxx11::string::~string((string *)local_1d0);
  this = &pZVar4->f;
  File::Write<unsigned_char>(this,(uchar *)local_e8,(size_t)manifestMF._M_dataplus._M_p);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&certData.value,siglen[1] + 1,
             (allocator_type *)local_1d0);
  strcpy((char *)certData.value,(char *)*siglen);
  data_00 = (void *)certData.value;
LAB_0012806c:
  pvVar11 = (void *)((long)data_00 + 4);
  len = 4;
  do {
    if (*(char *)((long)pvVar11 + -4) == '\r') {
      if (((*(char *)((long)pvVar11 + -3) == '\n') && (*(char *)((long)pvVar11 + -2) == '\r')) &&
         (*(char *)((long)pvVar11 + -1) == '\n')) break;
    }
    else if (*(char *)((long)pvVar11 + -4) == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4a8,
                 "Signature-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\nSHA1-Digest-Manifest: ",
                 (allocator<char> *)local_1d0);
      base64_encode_abi_cxx11_(&local_68,(uchar *)(context.data + 0xf),0x14);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     &local_68);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,"\r\n\r\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(pemKey.field_2._M_local_buf + 8),(char *)certData.value,
                 (allocator<char> *)
                 &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&manifestMF.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&pemKey.field_2 + 8));
      std::__cxx11::string::~string((string *)(pemKey.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::string::~string
                ((string *)
                 &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_68);
      uVar5 = crc32_fast((void *)manifestMF.field_2._8_8_,(size_t)certSF._M_dataplus._M_p,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d0,"META-INF/CERT.SF",
                 (allocator<char> *)
                 &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      uVar14 = 0;
      uVar15 = 0;
      ZipArchive::addFile(pZStack_40,(string *)local_1d0,true,(uint64_t)certSF._M_dataplus._M_p,
                          (uint64_t)certSF._M_dataplus._M_p,0,uVar5,0);
      std::__cxx11::string::~string((string *)local_1d0);
      File::Write<unsigned_char>
                (this,(uchar *)manifestMF.field_2._8_8_,(size_t)certSF._M_dataplus._M_p);
      local_212[10] = '\0';
      local_212[0xb] = '\0';
      local_212[0xc] = '\0';
      local_212[0xd] = '\0';
      local_212[0xe] = '\0';
      local_212[0xf] = '\0';
      local_212[0x10] = '\0';
      local_212[0x11] = '\0';
      digest[0] = '\0';
      digest[1] = '\0';
      digest[2] = '\0';
      digest[3] = '\0';
      digest[4] = '\0';
      digest[5] = '\0';
      digest[6] = '\0';
      digest[7] = '\0';
      digest[8] = '\0';
      digest[9] = '\0';
      digest[10] = '\0';
      digest[0xb] = '\0';
      SHA1_Init((SHA_CTX *)local_5a8);
      SHA1_Update((SHA_CTX *)local_5a8,(void *)manifestMF.field_2._8_8_,
                  (size_t)certSF._M_dataplus._M_p);
      SHA1_Final(local_212 + 10,(SHA_CTX *)local_5a8);
      pemKey.field_2._8_8_ = 0;
      KeyStore::getKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0,
                       (KeyStore *)sig);
      pvVar13 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&pemKey.field_2 + 8)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (pvVar13,(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&sigHead.field_2 + 8),pvVar13);
      toPem_abi_cxx11_((string *)
                       &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&sigHead.field_2 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&sigHead.field_2 + 8));
      bp = BIO_new_mem_buf(sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,-1);
      rsa = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (rsa == (RSA *)0x0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar7 = &PTR__exception_00150af8;
        puVar7[1] = "Could not read valid RSA key";
        __cxa_throw(puVar7,&sign_exception::typeinfo,std::exception::~exception);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(sig + 0x20));
      asn1::readDER((DER *)local_1d0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      pZVar4 = pZStack_40;
      certSF.field_2._8_8_ = 0;
      certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar12 = *(char **)(certData._0_8_ + 8);
      uVar10 = 0;
      goto LAB_00128371;
    }
    pvVar11 = (void *)((long)pvVar11 + 1);
    len = len + 1;
  } while( true );
  SHA1_Init((SHA_CTX *)local_5a8);
  SHA1_Update((SHA_CTX *)local_5a8,data_00,len);
  SHA1_Final(local_528,(SHA_CTX *)local_5a8);
  base64_encode_abi_cxx11_((string *)local_1d0,local_528,0x14);
  uVar1 = *(undefined8 *)local_1d0;
  uVar2 = *(undefined8 *)((long)local_1d0 + 8);
  uVar3 = *(undefined8 *)((long)local_1d0 + 0x14);
  *(undefined8 *)((long)pvVar11 + -0x14) = *(undefined8 *)((long)local_1d0 + 0xc);
  *(undefined8 *)((long)pvVar11 + -0xc) = uVar3;
  *(undefined8 *)((long)pvVar11 + -0x20) = uVar1;
  *(undefined8 *)((long)pvVar11 + -0x18) = uVar2;
  std::__cxx11::string::~string((string *)local_1d0);
  data_00 = pvVar11;
  goto LAB_0012806c;
LAB_00128371:
  if (pcVar12 == *(char **)(certData._0_8_ + 0x10)) {
LAB_00128992:
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = &PTR__exception_00150af8;
    puVar7[1] = "Could not extract certificate from keystore";
    __cxa_throw(puVar7,&sign_exception::typeinfo,std::exception::~exception);
  }
  uVar8 = uVar10;
  if (uVar10 == 0) {
    uVar8 = *(uint *)(pcVar12 + 0x58);
  }
  if (*pcVar12 == '\x02') {
    uVar10 = uVar8;
  }
  if ((*pcVar12 == '0') && (**(char **)(pcVar12 + 8) == '1')) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&certSF.field_2 + 8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pcVar12 + 0x20));
    if (certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)certSF.field_2._8_8_) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,0x400,
                 (allocator_type *)&local_68);
      pvVar13 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_44;
      RSA_sign(0x40,local_212 + 10,0x14,
               certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,(uint *)pvVar13,rsa);
      RSA_free(rsa);
      BIO_free_all(bp);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_44);
      stack0xfffffffffffffaed = 0x7010df78648862a;
      __l._M_len = 9;
      __l._M_array = sha + 0xd;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8,__l,&local_35);
      asn1::mkBIN((vec8 *)&local_68,'\x06',(vec8 *)&local_1e8);
      asn1::mkINT((vec8 *)&local_440,1);
      builtin_memcpy(local_212,"+\x0e\x03\x02\x1a",5);
      __l_00._M_len = 5;
      __l_00._M_array = local_212;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3e0,__l_00,
                 &local_34);
      asn1::mkBIN((vec8 *)&local_3f8,'\x06',(vec8 *)&local_3e0);
      asn1::mkNIL();
      p_Var9 = &local_3c8;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410,(asn1 *)0x30,
                 (uint8_t)&local_3f8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9
                 ,pvVar13);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428,(asn1 *)0x31,
                 (uint8_t)&local_410,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9
                );
      local_50a[0] = '*';
      local_50a[1] = 0x86;
      local_50a[2] = 'H';
      local_50a[3] = 0x86;
      local_50a[4] = 0xf7;
      local_50a[5] = '\r';
      local_50a[6] = '\x01';
      local_50a[7] = '\a';
      local_50a[8] = 1;
      __a = &local_33;
      __l_01._M_len = 9;
      __l_01._M_array = local_50a;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_380,__l_01,__a);
      asn1::mkBIN((vec8 *)&local_398,'\x06',(vec8 *)&local_380);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3b0,(asn1 *)0x30,
                 (uint8_t)&local_398,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,(asn1 *)0xa0,
                 (char)&digestCopy + '\x10',
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
      asn1::mkINT((vec8 *)&local_338,1);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_308,(asn1 *)0x30,
                 (char)&certSF + '\x18',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a
                );
      asn1::mkINT((vec8 *)&local_2f0,(ulong)uVar10);
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_320,(asn1 *)0x30,
                 (uint8_t)&local_308,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f0,pvVar13);
      builtin_memcpy(local_212 + 5,"+\x0e\x03\x02\x1a",5);
      __l_02._M_len = 5;
      __l_02._M_array = local_212 + 5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8,__l_02,
                 &local_32);
      asn1::mkBIN((vec8 *)&local_2c0,'\x06',(vec8 *)&local_2a8);
      asn1::mkNIL();
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8,(asn1 *)0x30,
                 (uint8_t)&local_2c0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_290,pvVar13);
      local_50a[9] = '*';
      local_50a[10] = 0x86;
      local_50a[0xb] = 'H';
      local_50a[0xc] = 0x86;
      local_50a[0xd] = 0xf7;
      local_50a[0xe] = '\r';
      local_50a[0xf] = '\x01';
      local_50a[0x10] = '\x01';
      local_50a[0x11] = 1;
      __l_03._M_len = 9;
      __l_03._M_array = local_50a + 9;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_248,__l_03,
                 &local_31);
      asn1::mkBIN((vec8 *)&local_260,'\x06',(vec8 *)&local_248);
      asn1::mkNIL();
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278,(asn1 *)0x30,
                 (uint8_t)&local_260,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_230,pvVar13);
      asn1::mkBIN((vec8 *)&local_4c0,'\x04',
                  (vec8 *)&certificate.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      p_Var9 = &local_320;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_350,(asn1 *)0x30,
                 (uint8_t)&local_338,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9
                 ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_4c0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffa54,CONCAT22(uVar15,uVar14)));
      pvVar13 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&head.field_2 + 8);
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (pvVar13,(asn1 *)0x31,(uint8_t)&local_350,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9);
      p_Var9 = &local_428;
      v_1 = &local_3b0;
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_458,(asn1 *)0x30,
                 (uint8_t)&local_440,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9
                 ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,pvVar13,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffa54,CONCAT22(uVar15,uVar14)));
      asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_470,(asn1 *)0xa0,
                 (uint8_t)&local_458,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var9
                );
      asn1::
      mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(asn1 *)0x30,(uint8_t)&local_68,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_470,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_470);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_458);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&head.field_2 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_350);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_4c0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_278);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_230);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_260);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_248);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2d8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_290);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2c0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2a8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_320);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2f0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_308);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_338);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_368);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_398);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_380);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_428);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_410);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_440);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1e8);
      uVar5 = crc32_fast(certMetaData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                         (long)data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                         (long)certMetaData.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"META-INF/CERT.RSA",(allocator<char> *)&local_1e8);
      ZipArchive::addFile(pZVar4,&local_68,true,
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                          (long)certMetaData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start -
                          (long)certMetaData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0,uVar5,0);
      std::__cxx11::string::~string((string *)&local_68);
      File::Write<unsigned_char>
                (this,certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start -
                 (long)certMetaData.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&certSF.field_2 + 8));
      asn1::DER::~DER((DER *)local_1d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&pemKey.field_2 + 8));
      std::__cxx11::string::~string((string *)(manifestMF.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_4a8);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&certData.value);
      std::__cxx11::string::~string((string *)local_e8);
      iVar6 = std::__cxx11::string::~string((string *)local_4f8);
      return iVar6;
    }
    goto LAB_00128992;
  }
  pcVar12 = pcVar12 + 0x60;
  goto LAB_00128371;
}

Assistant:

void sign(ZipArchive& zipArchive, KeyStore& keyStore, const string& digestFile)
{
    SHA_CTX context;
    string head = "Manifest-Version: 1.0\015\012Created-By: 1.0 "
                  "(Fastzip)\015\012\015\012";

    string manifestMF = head + digestFile;
    uint8_t manifestSha[SHA_LEN];
    SHA1_Init(&context);
    SHA1_Update(&context, manifestMF.c_str(), manifestMF.length());
    SHA1_Final(manifestSha, &context);

    uint32_t checksum = crc32_fast(manifestMF.c_str(), manifestMF.length());
    zipArchive.addFile("META-INF/MANIFEST.MF", true, manifestMF.length(),
                       manifestMF.length(), 0, checksum);
    zipArchive.write((uint8_t*)manifestMF.c_str(), manifestMF.length());

    unsigned char sha[SHA_LEN];

    vector<char> digestCopy(digestFile.length() + 1);
    strcpy(&digestCopy[0], digestFile.c_str());

    char* digestPtr = &digestCopy[0];
    while (true) {
        char* ptr = digestPtr;

        while (*ptr) {
            if (ptr[0] == 0x0d && ptr[1] == 0xa && ptr[2] == 0x0d &&
                ptr[3] == 0x0a)
                break;
            ptr++;
        }

        if (!*ptr)
            break;

        ptr += 4;

        SHA1_Init(&context);
        SHA1_Update(&context, digestPtr, ptr - digestPtr);
        SHA1_Final(sha, &context);
        memcpy(ptr - 32, base64_encode(sha, SHA_LEN).c_str(), 28);

        digestPtr = ptr;
    }
    const string sigHead = "Signature-Version: 1.0\015\012Created-By: 1.0 "
                           "(Fastzip)\015\012SHA1-Digest-Manifest: ";

    string certSF = sigHead + base64_encode(manifestSha, SHA_LEN) +
                    "\015\012\015\012" + string(&digestCopy[0]);

    checksum = crc32_fast(certSF.c_str(), certSF.length());
    zipArchive.addFile("META-INF/CERT.SF", true, certSF.length(),
                       certSF.length(), 0, checksum);
    zipArchive.write((uint8_t*)certSF.c_str(), certSF.length());

    unsigned char digest[SHA_LEN];
    memset(digest, 0, SHA_LEN);

    SHA1_Init(&context);
    SHA1_Update(&context, certSF.c_str(), certSF.size());
    SHA1_Final(digest, &context);

    vector<uint8_t> key;
    try {
        key = keyStore.getKey();
    } catch (key_exception& ke) {
        throw sign_exception(ke);
    }

    string pemKey = toPem(key);
    BIO* bio = BIO_new_mem_buf((void*)pemKey.c_str(), -1);
    RSA* rsa = PEM_read_bio_RSAPrivateKey(bio, NULL, NULL, NULL);
    if (rsa == nullptr)
        throw sign_exception("Could not read valid RSA key");

    vector<uint8_t> certificate = keyStore.getCert();

    // Extract the meta data
    DER certData = readDER(certificate);

    vector<uint8_t> certMetaData;
    uint32_t timeStamp = 0;
    for (auto& cd : certData[0]) {
        if (cd.tag == 0x02 && timeStamp == 0) {
            timeStamp = cd.value;
        }
        if (cd.tag == 0x30 && cd[0].tag == 0x31) {
            certMetaData = cd.data;
            break;
        }
    }

    if (certMetaData.size() == 0)
        throw sign_exception("Could not extract certificate from keystore");

    vector<uint8_t> sign(1024);
    unsigned int signLen;

    RSA_sign(NID_sha1, digest, SHA_LEN, &sign[0], &signLen, rsa);

    RSA_free(rsa);

    BIO_free_all(bio);

    sign.resize(signLen);
    // clang-format off
    auto data =
        mkSEQ(0x30,
            // PKCS7 SIGNED
            mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x02 }),
            mkSEQ(0xA0,
                mkSEQ(0x30,
                    mkINT(1),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            // SHA1
                            mkBIN(0x6, { 0x2b, 0x0e, 0x03, 0x02, 0x1a }),
                            mkNIL()
                            )
                        ),
                    mkSEQ(0x30,
                        // PKC7
                        mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x01 })
                        ),
                    mkSEQ(0xA0, certificate),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            mkINT(1),
                            mkSEQ(0x30,
                                mkSEQ(0x30, certMetaData),
                                mkINT(timeStamp)
                                ),
                            mkSEQ(0x30,
                                // SHA1
                                mkBIN(0x6, { 0x2b, 0xe, 0x3, 0x2, 0x1a}),
                                mkNIL()
                                ),
                            mkSEQ(0x30,
                                // RSA ENCRYPTION,
                                mkBIN(0x6, {0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x01 }),
                                mkNIL()
                                ),
                            mkBIN(0x04, sign)
                            )
                        )
                    )
                )
            );
	// clang-format off
    checksum = crc32_fast(&data[0], data.size());
    zipArchive.addFile("META-INF/CERT.RSA", true, data.size(), data.size(), 0, checksum);
    zipArchive.write(&data[0], data.size());
}